

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<optTyped_valueConstructorConstRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>_>
::CreateTest(TestFactoryImpl<optTyped_valueConstructorConstRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>_>
             *this)

{
  Test *this_00;
  TestFactoryImpl<optTyped_valueConstructorConstRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>_>
  *this_local;
  
  this_00 = (Test *)operator_new(0x18);
  optTyped_valueConstructorConstRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::
  optTyped_valueConstructorConstRvalue_Test
            ((optTyped_valueConstructorConstRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
              *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }